

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Threads.cpp
# Opt level: O3

void __thiscall
xmrig::Threads<xmrig::CpuThreads>::toJSON(Threads<xmrig::CpuThreads> *this,Value *out,Document *doc)

{
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  const_iterator cVar1;
  Document *doc_00;
  Data local_58 [2];
  
  allocator = doc->allocator_;
  String::String((String *)&local_58[0].s,"cn/blur");
  cVar1 = std::
          _Rb_tree<xmrig::String,_std::pair<const_xmrig::String,_xmrig::CpuThreads>,_std::_Select1st<std::pair<const_xmrig::String,_xmrig::CpuThreads>_>,_std::less<xmrig::String>,_std::allocator<std::pair<const_xmrig::String,_xmrig::CpuThreads>_>_>
          ::find((_Rb_tree<xmrig::String,_std::pair<const_xmrig::String,_xmrig::CpuThreads>,_std::_Select1st<std::pair<const_xmrig::String,_xmrig::CpuThreads>_>,_std::less<xmrig::String>,_std::allocator<std::pair<const_xmrig::String,_xmrig::CpuThreads>_>_>
                  *)this,(key_type *)&local_58[0].s);
  if (local_58[0].n.i64 != 0) {
    operator_delete__((void *)local_58[0]._0_8_);
  }
  if ((_Rb_tree_header *)cVar1._M_node != &(this->m_profiles)._M_t._M_impl.super__Rb_tree_header) {
    String::String((String *)&local_58[0].s,"cn/blur");
    doc_00 = (Document *)
             std::
             map<xmrig::String,_xmrig::CpuThreads,_std::less<xmrig::String>,_std::allocator<std::pair<const_xmrig::String,_xmrig::CpuThreads>_>_>
             ::at(&this->m_profiles,(key_type *)&local_58[0].s);
    if (local_58[0].n.i64 != 0) {
      operator_delete__((void *)local_58[0]._0_8_);
    }
    CpuThreads::toJSON((CpuThreads *)((long)local_58 + 0x18),doc_00);
    local_58[0].s.str = (Ch *)0x40500000018b893;
    local_58[0].n = (Number)0x7;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember(out,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_58[0].s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)((long)local_58 + 0x18),allocator);
  }
  return;
}

Assistant:

void xmrig::Threads<T>::toJSON(rapidjson::Value &out, rapidjson::Document &doc) const
{
    using namespace rapidjson;
    auto &allocator = doc.GetAllocator();

    if (has())
    {
        auto &ct = get();
        out.AddMember("cn/blur", ct.toJSON(doc), allocator);
    }   
}